

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

shared_ptr<chrono::ChLinkMotorRotationSpeed> __thiscall
chrono::turtlebot::AddMotor
          (turtlebot *this,shared_ptr<chrono::ChBody> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,shared_ptr<chrono::ChBodyAuxRef> *chassis,
          ChSystem *system,ChVector<double> *rel_joint_pos,ChQuaternion<double> *rel_joint_rot,
          shared_ptr<chrono::ChFunction_Const> *speed_func)

{
  double dVar1;
  long *plVar2;
  element_type *peVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChLinkMotorRotationSpeed *this_00;
  ChFrame<double> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  shared_ptr<chrono::ChLinkMotorRotationSpeed> sVar9;
  ChFrame<double> X_GC;
  undefined1 local_219;
  element_type *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  shared_ptr<chrono::ChFunction> local_1f8;
  undefined8 local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  ChSystem *local_1d8;
  shared_ptr<chrono::ChBodyAuxRef> *local_1d0;
  undefined **local_1c8;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  ChMatrix33<double> local_188;
  ChFrame<double> local_140;
  undefined1 local_b8 [40];
  double local_90;
  double dStack_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  local_1d8 = system;
  local_1d0 = body_2;
  this_01 = (ChFrame<double> *)
            (**(code **)(*(long *)(chassis->
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x1f0))();
  local_b8._0_8_ = &PTR__ChFrame_0017db90;
  dVar1 = rel_joint_pos->m_data[2];
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  auVar7._16_8_ = dVar1;
  auVar7._24_8_ = dVar1;
  auVar7 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])rel_joint_pos->m_data),auVar7,0x30);
  dVar1 = rel_joint_rot->m_data[0];
  auVar8._8_8_ = dVar1;
  auVar8._0_8_ = dVar1;
  auVar8._16_8_ = dVar1;
  auVar8._24_8_ = dVar1;
  local_b8._8_32_ = vblendps_avx(auVar7,auVar8,0xc0);
  local_90 = rel_joint_rot->m_data[1];
  dStack_88 = rel_joint_rot->m_data[2];
  local_80 = rel_joint_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_78,rel_joint_rot);
  ChFrame<double>::operator*(&local_140,this_01,(ChFrame<double> *)local_b8);
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkMotorRotationSpeed,std::allocator<chrono::ChLinkMotorRotationSpeed>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (ChLinkMotorRotationSpeed **)this,
             (allocator<chrono::ChLinkMotorRotationSpeed> *)&local_219);
  local_208 = (body_1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  plVar2 = *(long **)this;
  if (local_208 != (element_type *)0x0) {
    local_208 = local_208 + 0x78;
  }
  local_200 = (body_1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_200->_M_use_count = local_200->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_200->_M_use_count = local_200->_M_use_count + 1;
    }
  }
  peVar3 = (local_1d0->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_218 = peVar3 + 0x78;
  if (peVar3 == (element_type *)0x0) {
    local_218 = (element_type *)0x0;
  }
  local_210 = (local_1d0->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_210->_M_use_count = local_210->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_210->_M_use_count = local_210->_M_use_count + 1;
    }
  }
  local_1c8 = &PTR__ChFrame_0017db90;
  local_1c0 = local_140.coord.pos.m_data[0];
  dStack_1b8 = local_140.coord.pos.m_data[1];
  dStack_1b0 = local_140.coord.pos.m_data[2];
  dStack_1a8 = local_140.coord.rot.m_data[0];
  local_1a0 = local_140.coord.rot.m_data[1];
  dStack_198 = local_140.coord.rot.m_data[2];
  local_190 = local_140.coord.rot.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_188,&local_140.coord.rot);
  (**(code **)(*plVar2 + 0x240))(plVar2,&local_208,&local_218,&local_1c8);
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  local_1e8 = *(undefined8 *)this;
  p_Stack_1e0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  lVar4 = *(long *)(this + 8);
  if (lVar4 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
    }
  }
  (**(code **)(*(long *)local_1d8 + 0x138))(local_1d8,&local_1e8);
  if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
  }
  local_1f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (speed_func->super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (speed_func->super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  p_Var5 = (speed_func->super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  this_00 = *(ChLinkMotorRotationSpeed **)this;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  ChLinkMotorRotationSpeed::SetSpeedFunction(this_00,&local_1f8);
  _Var6._M_pi = extraout_RDX;
  if (local_1f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar9.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var6._M_pi;
  sVar9.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationSpeed>)
         sVar9.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationSpeed> AddMotor(std::shared_ptr<ChBody> body_1,
                                                   std::shared_ptr<ChBodyAuxRef> body_2,
                                                   std::shared_ptr<ChBodyAuxRef> chassis,
                                                   ChSystem* system,
                                                   const ChVector<>& rel_joint_pos,
                                                   const ChQuaternion<>& rel_joint_rot,
                                                   std::shared_ptr<ChFunction_Const> speed_func) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);            // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child

    auto motor_angle = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
    motor_angle->Initialize(body_1, body_2, ChFrame<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    system->AddLink(motor_angle);
    motor_angle->SetSpeedFunction(speed_func);
    return motor_angle;
}